

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<TPZFlopCounter>::GetSub
          (TPZMatrix<TPZFlopCounter> *this,TPZVec<long> *indices,TPZFMatrix<TPZFlopCounter> *block)

{
  long lVar1;
  TPZFMatrix<TPZFlopCounter> *this_00;
  long *plVar2;
  TPZFlopCounter *pTVar3;
  TPZVec<long> *in_RSI;
  long *in_RDI;
  REAL RVar4;
  int64_t jel;
  int64_t iel;
  int64_t nel;
  long index;
  long index_00;
  
  this_00 = (TPZFMatrix<TPZFlopCounter> *)TPZVec<long>::NElements(in_RSI);
  for (index_00 = 0; index_00 < (long)this_00; index_00 = index_00 + 1) {
    for (index = 0; index < (long)this_00; index = index + 1) {
      plVar2 = TPZVec<long>::operator[](in_RSI,index_00);
      lVar1 = *plVar2;
      plVar2 = TPZVec<long>::operator[](in_RSI,index);
      RVar4 = (REAL)(**(code **)(*in_RDI + 0x120))(in_RDI,lVar1,*plVar2);
      pTVar3 = TPZFMatrix<TPZFlopCounter>::operator()(this_00,index_00,index);
      pTVar3->fVal = RVar4;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}